

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O1

void sylvan_set_limits(size_t memorycap,int table_ratio,int initial_ratio)

{
  bool bVar1;
  reg_quit_entry *prVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  quit_cb p_Var6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auStack_68 [56];
  undefined8 uStack_30;
  
  if (table_ratio - 0xbU < 0xffffffeb) {
    uStack_30._0_1_ = -0x12;
    uStack_30._1_1_ = 'j';
    uStack_30._2_1_ = '\x10';
    uStack_30._3_1_ = '\0';
    uStack_30._4_1_ = '\0';
    uStack_30._5_1_ = '\0';
    uStack_30._6_1_ = '\0';
    uStack_30._7_1_ = '\0';
    sylvan_set_limits_cold_3();
  }
  else {
    uVar7 = 1L << ((ulong)(uint)table_ratio & 0x3f);
    uVar10 = 1L << ((ulong)(byte)-(char)table_ratio & 0x3f);
    if (table_ratio < 1) {
      uVar7 = 1;
    }
    else {
      uVar10 = 1;
    }
    lVar4 = 0x18L << ((ulong)(uint)table_ratio & 0x3f);
    if (table_ratio < 1) {
      lVar4 = 0x18;
    }
    lVar9 = 0x24L << ((ulong)(byte)-(char)table_ratio & 0x3f);
    if (0 < table_ratio) {
      lVar9 = 0x24;
    }
    p_Var6 = (quit_cb)memorycap;
    if (memorycap < (ulong)(lVar9 + lVar4)) {
      uStack_30._0_1_ = -0x1c;
      uStack_30._1_1_ = 'j';
      uStack_30._2_1_ = '\x10';
      uStack_30._3_1_ = '\0';
      uStack_30._4_1_ = '\0';
      uStack_30._5_1_ = '\0';
      uStack_30._6_1_ = '\0';
      uStack_30._7_1_ = '\0';
      sylvan_set_limits_cold_1();
    }
    uVar3 = (lVar9 + lVar4) * 2;
    uVar5 = uVar7;
    if (uVar7 >> 0x2a == 0 && uVar3 < memorycap) {
      do {
        uVar7 = uVar5 * 2;
        uVar10 = uVar10 * 2;
        uVar3 = uVar3 * 2;
        if (memorycap <= uVar3) break;
        uVar8 = uVar5 >> 0x29;
        uVar5 = uVar7;
      } while (uVar8 == 0);
    }
    memorycap = (size_t)p_Var6;
    if (-1 < initial_ratio) {
      table_min = uVar7;
      cache_min = uVar10;
      if (((initial_ratio != 0) && (0x1000 < uVar7)) &&
         (uVar3 = uVar7, uVar5 = uVar10, 0x1000 < uVar10)) {
        do {
          table_min = uVar3 >> 1;
          cache_min = uVar5 >> 1;
          if (initial_ratio < 2) {
            table_max = uVar7;
            cache_max = uVar10;
            return;
          }
          if (uVar3 < 0x2002) {
            table_max = uVar7;
            cache_max = uVar10;
            return;
          }
          initial_ratio = initial_ratio + -1;
          bVar1 = 0x2001 < uVar5;
          uVar3 = table_min;
          uVar5 = cache_min;
        } while (bVar1);
      }
      table_max = uVar7;
      cache_max = uVar10;
      return;
    }
  }
  uStack_30 = sylvan_init_package;
  sylvan_set_limits_cold_2();
  if (table_max == 0) {
    sylvan_init_package_cold_1();
    prVar2 = (reg_quit_entry *)malloc(0x10);
    prVar2->next = quit_register;
    prVar2->cb = (quit_cb)memorycap;
    quit_register = prVar2;
    return;
  }
  nodes = llmsset_create(table_min,table_max);
  cache_create(cache_min,cache_max);
  LOCK();
  gc = 0;
  UNLOCK();
  main_hook = sylvan_gc_aggressive_resize_CALL;
  auStack_68._0_8_ = sylvan_stats_init_WRAP;
  auStack_68._8_8_ = (_Worker *)0x1;
  lace_run_task((Task *)auStack_68);
  return;
}

Assistant:

void
sylvan_set_limits(size_t memorycap, int table_ratio, int initial_ratio)
{
    /* This method ONLY limits the "unique nodes table" and the "operation cache" which are the main
     * datastructures of Sylvan.
     *
     * Suggested limits:
     * - memorycap to whatever you want at most, in bytes.
     * - table_ratio to a number between -3 (8x bigger cache) and 3 (8x bigger nodes table)
     * - inital_ratio to something like 10 (start with 1024x smaller tables initially)
     */
    if (table_ratio < -10 || table_ratio > 10) {
        fprintf(stderr, "sylvan_set_limits: table_ratio unreasonable (between -10 and 10)\n");
        exit(1);
    }

    size_t max_t = 1;
    size_t max_c = 1;
    if (table_ratio > 0) {
        max_t <<= table_ratio;
    } else {
        max_c <<= -table_ratio;
    }

    size_t cur = max_t * 24 + max_c * 36;
    if (cur > memorycap) {
        fprintf(stderr, "sylvan_set_limits: memory cap incompatible with requested table ratio\n");
    }

    while (2*cur < memorycap && max_t < 0x0000040000000000) {
        max_t *= 2;
        max_c *= 2;
        cur *= 2;
    }

    if (initial_ratio < 0) {
        fprintf(stderr, "sylvan_set_limits: initial_ratio unreasonable (may not be negative)\n");
        exit(1);
    }

    size_t min_t = max_t, min_c = max_c;
    while (initial_ratio > 0 && min_t > 0x1000 && min_c > 0x1000) {
        min_t >>= 1;
        min_c >>= 1;
        initial_ratio--;
    }

    table_min = min_t;
    table_max = max_t;
    cache_min = min_c;
    cache_max = max_c;
}